

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.cpp
# Opt level: O2

bool fs_is_case_sensitive(string_view path)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  __type _Var4;
  size_type sVar5;
  string_view path_00;
  string_view path_01;
  string_view path_02;
  string CamelCase;
  string lower;
  string_view path_local;
  string rname;
  string p;
  string actual;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  if (path_local._M_len == 0) {
    _Var4 = false;
  }
  else {
    fs_generate_random_alphanumeric_string_abi_cxx11_(&rname,0x10);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&p,&path_local,(allocator<char> *)&CamelCase);
    std::operator+(&lower,&p,"/.FfilesystemCaseSensitiveCheck_");
    std::operator+(&CamelCase,&lower,&rname);
    std::__cxx11::string::~string((string *)&lower);
    path_01._M_str = CamelCase._M_dataplus._M_p;
    path_01._M_len = CamelCase._M_string_length;
    bVar3 = fs_touch(path_01);
    sVar2 = CamelCase._M_string_length;
    _Var1 = CamelCase._M_dataplus;
    if (bVar3) {
      lower._M_dataplus._M_p = (pointer)&lower.field_2;
      lower._M_string_length = 0;
      lower.field_2._M_local_buf[0] = '\0';
      for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
        tolower((int)_Var1._M_p[sVar5]);
        std::__cxx11::string::push_back((char)&lower);
      }
      path_00._M_str = lower._M_dataplus._M_p;
      path_00._M_len = lower._M_string_length;
      fs_canonical_abi_cxx11_(&actual,path_00,true,true);
      if (rname._M_string_length != 0) {
        path_02._M_str = CamelCase._M_dataplus._M_p;
        path_02._M_len = CamelCase._M_string_length;
        fs_remove(path_02);
      }
      _Var4 = std::operator==(&actual,&CamelCase);
      std::__cxx11::string::~string((string *)&actual);
      std::__cxx11::string::~string((string *)&lower);
    }
    else {
      _Var4 = false;
    }
    std::__cxx11::string::~string((string *)&CamelCase);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)&rname);
  }
  return _Var4;
}

Assistant:

bool fs_is_case_sensitive(std::string_view path)
{
  // check if the filesystem is case sensitive
  if(path.empty())
    return false;

  const std::string rname = fs_generate_random_alphanumeric_string(16);
  std::string p(path);
  // create a temporary file with a unique name that has CamelCase
  const std::string CamelCase = p + "/.FfilesystemCaseSensitiveCheck_" + rname;

  if(!fs_touch(CamelCase))
    return false;

  std::string lower;
  std::transform(CamelCase.begin(), CamelCase.end(), std::back_inserter(lower), ::tolower);

  const std::string actual = fs_canonical(lower, true, true);

  if(!rname.empty())
    fs_remove(CamelCase);

  return actual == CamelCase;

}